

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall Fl_Tree::first_visible_item(Fl_Tree *this)

{
  Fl_Tree_Item *this_00;
  
  this_00 = this->_root;
  if ((this->_prefs)._showroot == '\0') {
    if (this_00 != (Fl_Tree_Item *)0x0) goto LAB_001d8e0c;
    this_00 = (Fl_Tree_Item *)0x0;
  }
  while( true ) {
    if (this_00 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    if (this_00->_visible != '\0') break;
LAB_001d8e0c:
    this_00 = Fl_Tree_Item::next(this_00);
  }
  return this_00;
}

Assistant:

Fl_Tree_Item* Fl_Tree::first_visible_item() {
  Fl_Tree_Item *i = showroot() ? first() : next(first());
  while ( i ) {
    if ( i->visible() ) return(i);
    i = next(i);
  }
  return(0);
}